

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool string_parse_kv_override
               (char *data,
               vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *overrides)

{
  int iVar1;
  char *pcVar2;
  common_log *pcVar3;
  char *__s1;
  size_t sVar4;
  char *in_RDI;
  undefined8 in_R9;
  llama_model_kv_override kvo;
  char *sep;
  undefined4 uVar5;
  char acStack_124 [12];
  llama_model_kv_override *in_stack_fffffffffffffee8;
  vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
  *in_stack_fffffffffffffef0;
  double local_a0 [8];
  
  pcVar2 = strchr(in_RDI,0x3d);
  if ((pcVar2 == (char *)0x0) || (0x7f < (long)pcVar2 - (long)in_RDI)) {
    if (-1 < common_log_verbosity_thold) {
      pcVar3 = common_log_main();
      common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s: malformed KV override \'%s\'\n",
                     "string_parse_kv_override",in_RDI);
    }
    return false;
  }
  strncpy(acStack_124,in_RDI,(long)pcVar2 - (long)in_RDI);
  pcVar2[(long)(acStack_124 + -(long)in_RDI)] = '\0';
  __s1 = pcVar2 + 1;
  iVar1 = strncmp(__s1,"int:",4);
  if (iVar1 == 0) {
    local_a0[0] = (double)atol(pcVar2 + 5);
  }
  else {
    iVar1 = strncmp(__s1,"float:",6);
    if (iVar1 == 0) {
      local_a0[0] = atof(pcVar2 + 7);
    }
    else {
      iVar1 = strncmp(__s1,"bool:",5);
      if (iVar1 == 0) {
        uVar5 = 2;
        iVar1 = strcmp(pcVar2 + 6,"true");
        if (iVar1 == 0) {
          local_a0[0] = (double)CONCAT71(local_a0[0]._1_7_,1);
        }
        else {
          iVar1 = strcmp(pcVar2 + 6,"false");
          if (iVar1 != 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar3 = common_log_main();
              common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,
                             "%s: invalid boolean value for KV override \'%s\'\n",
                             "string_parse_kv_override",in_RDI,in_R9,uVar5);
            }
            return false;
          }
          local_a0[0] = (double)((ulong)local_a0[0] & 0xffffffffffffff00);
        }
      }
      else {
        iVar1 = strncmp(__s1,"str:",4);
        if (iVar1 != 0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar3 = common_log_main();
            common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s: invalid type for KV override \'%s\'\n",
                           "string_parse_kv_override",in_RDI);
          }
          return false;
        }
        uVar5 = 3;
        sVar4 = strlen(pcVar2 + 5);
        if (0x7f < sVar4) {
          if (-1 < common_log_verbosity_thold) {
            pcVar3 = common_log_main();
            common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,
                           "%s: malformed KV override \'%s\', value cannot exceed 127 chars\n",
                           "string_parse_kv_override",in_RDI,in_R9,uVar5);
          }
          return false;
        }
        strncpy((char *)local_a0,pcVar2 + 5,0x7f);
      }
    }
  }
  std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
  emplace_back<llama_model_kv_override>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return true;
}

Assistant:

bool string_parse_kv_override(const char * data, std::vector<llama_model_kv_override> & overrides) {
    const char * sep = strchr(data, '=');
    if (sep == nullptr || sep - data >= 128) {
        LOG_ERR("%s: malformed KV override '%s'\n", __func__, data);
        return false;
    }
    llama_model_kv_override kvo;
    std::strncpy(kvo.key, data, sep - data);
    kvo.key[sep - data] = 0;
    sep++;
    if (strncmp(sep, "int:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_INT;
        kvo.val_i64 = std::atol(sep);
    } else if (strncmp(sep, "float:", 6) == 0) {
        sep += 6;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_FLOAT;
        kvo.val_f64 = std::atof(sep);
    } else if (strncmp(sep, "bool:", 5) == 0) {
        sep += 5;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_BOOL;
        if (std::strcmp(sep, "true") == 0) {
            kvo.val_bool = true;
        } else if (std::strcmp(sep, "false") == 0) {
            kvo.val_bool = false;
        } else {
            LOG_ERR("%s: invalid boolean value for KV override '%s'\n", __func__, data);
            return false;
        }
    } else if (strncmp(sep, "str:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_STR;
        if (strlen(sep) > 127) {
            LOG_ERR("%s: malformed KV override '%s', value cannot exceed 127 chars\n", __func__, data);
            return false;
        }
        strncpy(kvo.val_str, sep, 127);
        kvo.val_str[127] = '\0';
    } else {
        LOG_ERR("%s: invalid type for KV override '%s'\n", __func__, data);
        return false;
    }
    overrides.emplace_back(std::move(kvo));
    return true;
}